

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O0

BOOL compare_opcodes(PCRE2_SPTR8 code,BOOL utf,compile_block_8 *cb,uint32_t *base_list,
                    PCRE2_SPTR8 base_end,int *rec_limit)

{
  byte bVar1;
  uint uVar2;
  BOOL BVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte *local_170;
  byte *local_160;
  bool local_101;
  byte *local_100;
  byte *local_f8;
  BOOL bothprop;
  BOOL risprop;
  BOOL lisprop;
  BOOL same;
  uint8_t *p;
  int n;
  uint32_t rightop;
  uint32_t leftop;
  BOOL entered_a_group;
  BOOL invert_bits;
  BOOL accepted;
  uint32_t chr;
  uint8_t *set_end;
  uint8_t *set2;
  uint8_t *set1;
  uint8_t *class_bitset;
  PCRE2_SPTR8 xclass_flags;
  PCRE2_SPTR8 next_code;
  uint32_t *list_ptr;
  uint32_t *ochr_ptr;
  uint32_t *chr_ptr;
  uint32_t list [8];
  PCRE2_UCHAR8 c;
  int *rec_limit_local;
  PCRE2_SPTR8 base_end_local;
  uint32_t *base_list_local;
  compile_block_8 *cb_local;
  byte *pbStack_18;
  BOOL utf_local;
  PCRE2_SPTR8 code_local;
  
  bVar1 = 0;
  iVar4 = *rec_limit;
  *rec_limit = iVar4 + -1;
  pbStack_18 = code;
  if (iVar4 + -1 < 1) {
    return 0;
  }
LAB_0014d51a:
  do {
    while( true ) {
      for (; list[7]._3_1_ = *pbStack_18, list[7]._3_1_ == 0x76; pbStack_18 = pbStack_18 + 6) {
      }
      if (list[7]._3_1_ != 0x77) break;
      pbStack_18 = pbStack_18 + (int)(uint)CONCAT11(pbStack_18[5],pbStack_18[6]);
    }
    if (list[7]._3_1_ == 0x78) {
      do {
        pbStack_18 = pbStack_18 + (int)(uint)CONCAT11(pbStack_18[1],pbStack_18[2]);
      } while (*pbStack_18 == 0x78);
      list[7]._3_1_ = *pbStack_18;
    }
    uVar2 = (uint)list[7]._3_1_;
    if (uVar2 == 0) {
LAB_0014d62a:
      return (uint)(base_list[1] != 0);
    }
    if (uVar2 == 0x79) {
      if (base_list[1] == 0) {
        return 0;
      }
      if (pbStack_18
          [-(ulong)(ushort)(*(ushort *)(pbStack_18 + 1) << 8 | *(ushort *)(pbStack_18 + 1) >> 8)] -
          0x7e < 6) {
        return (uint)((bVar1 ^ 0xff) & 1);
      }
      pbStack_18 = pbStack_18 +
                   (int)(uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                              [list[7]._3_1_];
      goto LAB_0014d51a;
    }
    if (uVar2 == 0x7c) goto LAB_0014d62a;
    if ((2 < uVar2 - 0x82) && (uVar2 != 0x86)) {
      if (uVar2 - 0x94 < 2) {
        xclass_flags = pbStack_18 + 1;
        if ((((*xclass_flags != 0x84) && (*xclass_flags != 0x86)) && (*xclass_flags != 0x82)) &&
           (*xclass_flags != 0x83)) {
          return 0;
        }
        do {
          xclass_flags = xclass_flags + (int)(uint)CONCAT11(xclass_flags[1],xclass_flags[2]);
        } while (*xclass_flags == 'x');
        BVar3 = compare_opcodes(xclass_flags + 3,utf,cb,base_list,base_end,rec_limit);
        if (BVar3 == 0) {
          return 0;
        }
        pbStack_18 = pbStack_18 +
                     (int)(uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                                [list[7]._3_1_];
      }
      else {
        pbStack_18 = get_chr_property_list(pbStack_18,utf,cb->fcc,(uint32_t *)&chr_ptr);
        if (pbStack_18 == (byte *)0x0) {
          return 0;
        }
        if (*base_list == 0x1d) {
          ochr_ptr = base_list + 2;
          next_code = (PCRE2_SPTR8)&chr_ptr;
        }
        else {
          next_code = (PCRE2_SPTR8)base_list;
          if ((uint)chr_ptr != 0x1d) {
            if (((*base_list != 0x6e) && ((uint)chr_ptr != 0x6e)) &&
               ((utf != 0 || ((*base_list != 0x6f && ((uint)chr_ptr != 0x6f)))))) {
              uVar2 = *base_list;
              bVar10 = false;
              if ((uVar2 == 0x10) || (uVar2 == 0xf)) {
                if ((uint)chr_ptr == 0x18) {
                  bVar10 = true;
                }
                else if (((uint)chr_ptr == 0x10) || ((uint)chr_ptr == 0xf)) {
                  bVar7 = uVar2 == (uint)chr_ptr;
                  bVar8 = uVar2 == 0x10;
                  bVar9 = (uint)chr_ptr == 0x10;
                  local_101 = bVar8 && bVar9;
                  uVar2 = (uint)propposstab[base_list[2]][list[0]];
                  switch(uVar2) {
                  case 0:
                    break;
                  case 1:
                    bVar10 = local_101;
                    break;
                  case 2:
                    bVar10 = (base_list[3] == list[1]) != bVar7;
                    break;
                  case 3:
                    bVar10 = !bVar7;
                    break;
                  case 4:
                    bVar10 = false;
                    if (bVar9) {
                      bVar10 = (bool)catposstab[base_list[3]][list[1]] == bVar7;
                    }
                    break;
                  case 5:
                    bVar10 = false;
                    if (bVar8) {
                      bVar10 = (bool)catposstab[list[1]][base_list[3]] == bVar7;
                    }
                    break;
                  case 6:
                  case 7:
                  case 8:
                    iVar4 = uVar2 - 6;
                    bVar10 = false;
                    if (bVar9) {
                      bVar10 = false;
                      if ((list[1] != posspropstab[iVar4][0]) &&
                         (bVar10 = false, list[1] != posspropstab[iVar4][1])) {
                        bVar10 = list[1] != posspropstab[iVar4][2] || !bVar8;
                      }
                      bVar10 = bVar8 == bVar10;
                    }
                    break;
                  case 9:
                  case 10:
                  case 0xb:
                    iVar4 = uVar2 - 9;
                    bVar10 = false;
                    if (bVar8) {
                      bVar10 = false;
                      if ((base_list[3] != (uint)posspropstab[iVar4][0]) &&
                         (bVar10 = false, base_list[3] != (uint)posspropstab[iVar4][1])) {
                        bVar10 = base_list[3] != (uint)posspropstab[iVar4][2] || !bVar9;
                      }
                      bVar10 = bVar9 == bVar10;
                    }
                    break;
                  case 0xc:
                  case 0xd:
                  case 0xe:
                    iVar4 = uVar2 - 0xc;
                    bVar10 = false;
                    if (bVar9) {
                      bVar10 = false;
                      if ((catposstab[posspropstab[iVar4][0]][list[1]] != '\0') &&
                         (bVar10 = false, catposstab[posspropstab[iVar4][1]][list[1]] != '\0')) {
                        bVar10 = list[1] != posspropstab[iVar4][3] || !bVar8;
                      }
                      bVar10 = bVar8 == bVar10;
                    }
                    break;
                  case 0xf:
                  case 0x10:
                  case 0x11:
                    iVar4 = uVar2 - 0xf;
                    bVar10 = false;
                    if (bVar8) {
                      bVar10 = false;
                      if ((catposstab[posspropstab[iVar4][0]][base_list[3]] != '\0') &&
                         (bVar10 = false, catposstab[posspropstab[iVar4][1]][base_list[3]] != '\0'))
                      {
                        bVar10 = base_list[3] != (uint)posspropstab[iVar4][3] || !bVar9;
                      }
                      bVar10 = bVar9 == bVar10;
                    }
                  }
                }
              }
              else {
                bVar10 = false;
                if ((((5 < uVar2) && (bVar10 = false, uVar2 < 0x17)) &&
                    (bVar10 = false, 5 < (uint)chr_ptr)) && (bVar10 = false, (uint)chr_ptr < 0x1b))
                {
                  bVar10 = autoposstab[uVar2 - 6][(uint)chr_ptr - 6] != '\0';
                }
              }
              if (!bVar10) {
                return 0;
              }
              if (chr_ptr._4_4_ == 0) {
                return 1;
              }
              goto LAB_0014d51a;
            }
            if ((*base_list == 0x6e) || ((utf == 0 && (*base_list == 0x6f)))) {
              set2 = base_end + -(ulong)base_list[2];
              next_code = (PCRE2_SPTR8)&chr_ptr;
            }
            else {
              set2 = pbStack_18 + -(ulong)list[0];
            }
            bVar10 = false;
            iVar4 = *(int *)next_code;
            if (iVar4 == 6) {
              bVar10 = true;
LAB_0014dada:
              set_end = cb->cbits + 0x40;
            }
            else {
              if (iVar4 == 7) goto LAB_0014dada;
              if (iVar4 == 8) {
                bVar10 = true;
LAB_0014daf9:
                set_end = cb->cbits;
              }
              else {
                if (iVar4 == 9) goto LAB_0014daf9;
                if (iVar4 == 10) {
                  bVar10 = true;
LAB_0014db14:
                  set_end = cb->cbits + 0xa0;
                }
                else {
                  if (iVar4 == 0xb) goto LAB_0014db14;
                  if (iVar4 - 0x6eU < 2) {
                    local_f8 = base_end;
                    if ((uint32_t **)next_code == &chr_ptr) {
                      local_f8 = pbStack_18;
                    }
                    set_end = local_f8 + -(ulong)*(uint *)(next_code + 8);
                  }
                  else {
                    if (iVar4 != 0x70) {
                      return 0;
                    }
                    local_100 = base_end;
                    if ((uint32_t **)next_code == &chr_ptr) {
                      local_100 = pbStack_18;
                    }
                    if ((local_100[2 - (ulong)*(uint *)(next_code + 8)] & 4) != 0) {
                      return 0;
                    }
                    if ((local_100[2 - (ulong)*(uint *)(next_code + 8)] & 2) == 0) {
                      if (chr_ptr._4_4_ == 0) {
                        return 1;
                      }
                      goto LAB_0014d51a;
                    }
                    set_end = local_100 + (3 - (ulong)*(uint *)(next_code + 8));
                  }
                }
              }
            }
            puVar5 = set2 + 0x20;
            if (bVar10) {
              do {
                puVar6 = set2 + 1;
                if ((*set2 & (*set_end ^ 0xff)) != 0) {
                  return 0;
                }
                set_end = set_end + 1;
                set2 = puVar6;
              } while (puVar6 < puVar5);
            }
            else {
              do {
                puVar6 = set2 + 1;
                if ((*set2 & *set_end) != 0) {
                  return 0;
                }
                set_end = set_end + 1;
                set2 = puVar6;
              } while (puVar6 < puVar5);
            }
            if (chr_ptr._4_4_ == 0) {
              return 1;
            }
            goto LAB_0014d51a;
          }
          ochr_ptr = list;
        }
        do {
          uVar2 = *ochr_ptr;
          switch(*(undefined4 *)next_code) {
          case 6:
            if ((0xff < uVar2) || ((cb->ctypes[uVar2] & 4) == 0)) {
              return 0;
            }
            break;
          case 7:
            if ((uVar2 < 0x100) && ((cb->ctypes[uVar2] & 4) != 0)) {
              return 0;
            }
            break;
          case 8:
            if ((0xff < uVar2) || ((cb->ctypes[uVar2] & 1) == 0)) {
              return 0;
            }
            break;
          case 9:
            if ((uVar2 < 0x100) && ((cb->ctypes[uVar2] & 1) != 0)) {
              return 0;
            }
            break;
          case 10:
            if ((0xff < uVar2) || ((cb->ctypes[uVar2] & 0x10) == 0)) {
              return 0;
            }
            break;
          case 0xb:
            if ((uVar2 < 0xff) && ((cb->ctypes[uVar2] & 0x10) != 0)) {
              return 0;
            }
            break;
          default:
            return 0;
          case 0xf:
          case 0x10:
            BVar3 = check_char_prop(uVar2,*(uint *)(next_code + 8),*(uint *)(next_code + 0xc),
                                    (uint)(*(int *)next_code == 0xf));
            if (BVar3 == 0) {
              return 0;
            }
            break;
          case 0x11:
          case 0x15:
            if (((uVar2 - 10 < 4) || (uVar2 == 0x85)) || (uVar2 == 0x2028 || uVar2 == 0x2029)) {
              return 0;
            }
            break;
          case 0x12:
            if ((((((uVar2 != 9) && (uVar2 != 0x20)) && (uVar2 != 0xa0)) &&
                 ((uVar2 != 0x1680 && (uVar2 != 0x180e)))) && (10 < uVar2 - 0x2000)) &&
               (((uVar2 != 0x202f && (uVar2 != 0x205f)) && (uVar2 != 0x3000)))) {
              return 0;
            }
            break;
          case 0x13:
            if (((((uVar2 == 9) || (uVar2 == 0x20)) || (uVar2 == 0xa0)) ||
                ((uVar2 == 0x1680 || (uVar2 == 0x180e)))) ||
               (((uVar2 - 0x2000 < 0xb || ((uVar2 == 0x202f || (uVar2 == 0x205f)))) ||
                (uVar2 == 0x3000)))) {
              return 0;
            }
            break;
          case 0x14:
            if (((3 < uVar2 - 10) && (uVar2 != 0x85)) && (uVar2 != 0x2028 && uVar2 != 0x2029)) {
              return 0;
            }
            break;
          case 0x17:
          case 0x19:
            if (((uVar2 - 10 < 4) || (uVar2 == 0x85)) || (uVar2 == 0x2028 || uVar2 == 0x2029)) {
              return 0;
            }
            break;
          case 0x18:
            break;
          case 0x1d:
            list_ptr = (uint32_t *)(next_code + 8);
            do {
              if (uVar2 == *list_ptr) {
                return 0;
              }
              list_ptr = list_ptr + 1;
            } while (*list_ptr != 0xffffffff);
            break;
          case 0x1f:
            list_ptr = (uint32_t *)(next_code + 8);
            do {
              if (uVar2 == *list_ptr) break;
              list_ptr = list_ptr + 1;
            } while (*list_ptr != 0xffffffff);
            if (*list_ptr == 0xffffffff) {
              return 0;
            }
            break;
          case 0x6f:
            if (0xff < uVar2) {
              return 0;
            }
          case 0x6e:
            if (uVar2 < 0x100) {
              local_160 = base_end;
              if ((uint32_t **)next_code == &chr_ptr) {
                local_160 = pbStack_18;
              }
              if (((uint)local_160[(ulong)(uVar2 >> 3) - (ulong)*(uint *)(next_code + 8)] &
                  1 << ((byte)uVar2 & 7)) != 0) {
                return 0;
              }
            }
            break;
          case 0x70:
            local_170 = base_end;
            if ((uint32_t **)next_code == &chr_ptr) {
              local_170 = pbStack_18;
            }
            BVar3 = _pcre2_xclass_8(uVar2,local_170 + (2 - (ulong)*(uint *)(next_code + 8)),utf);
            if (BVar3 != 0) {
              return 0;
            }
          }
          ochr_ptr = ochr_ptr + 1;
        } while (*ochr_ptr != 0xffffffff);
        if (chr_ptr._4_4_ == 0) {
          return 1;
        }
      }
      goto LAB_0014d51a;
    }
    xclass_flags = pbStack_18 + (int)(uint)CONCAT11(pbStack_18[1],pbStack_18[2]);
    pbStack_18 = pbStack_18 +
                 (int)(uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x02\x02\x02\x02\x02\x02\x04\x04\x04\x02\x02\x02\x04\x01\x01\x01\x01\x01\x01\x05\x05\x01\x01\x01\x05!!"
                            [list[7]._3_1_];
    for (; *xclass_flags == 'x';
        xclass_flags = xclass_flags + (int)(uint)CONCAT11(xclass_flags[1],xclass_flags[2])) {
      BVar3 = compare_opcodes(pbStack_18,utf,cb,base_list,base_end,rec_limit);
      if (BVar3 == 0) {
        return 0;
      }
      pbStack_18 = xclass_flags + 3;
    }
    bVar1 = 1;
  } while( true );
}

Assistant:

static BOOL
compare_opcodes(PCRE2_SPTR code, BOOL utf, const compile_block *cb,
  const uint32_t *base_list, PCRE2_SPTR base_end, int *rec_limit)
{
PCRE2_UCHAR c;
uint32_t list[8];
const uint32_t *chr_ptr;
const uint32_t *ochr_ptr;
const uint32_t *list_ptr;
PCRE2_SPTR next_code;
#ifdef SUPPORT_WIDE_CHARS
PCRE2_SPTR xclass_flags;
#endif
const uint8_t *class_bitset;
const uint8_t *set1, *set2, *set_end;
uint32_t chr;
BOOL accepted, invert_bits;
BOOL entered_a_group = FALSE;

if (--(*rec_limit) <= 0) return FALSE;  /* Recursion has gone too deep */

/* Note: the base_list[1] contains whether the current opcode has a greedy
(represented by a non-zero value) quantifier. This is a different from
other character type lists, which store here that the character iterator
matches to an empty string (also represented by a non-zero value). */

for(;;)
  {
  /* All operations move the code pointer forward.
  Therefore infinite recursions are not possible. */

  c = *code;

  /* Skip over callouts */

  if (c == OP_CALLOUT)
    {
    code += PRIV(OP_lengths)[c];
    continue;
    }

  if (c == OP_CALLOUT_STR)
    {
    code += GET(code, 1 + 2*LINK_SIZE);
    continue;
    }

  if (c == OP_ALT)
    {
    do code += GET(code, 1); while (*code == OP_ALT);
    c = *code;
    }

  switch(c)
    {
    case OP_END:
    case OP_KETRPOS:
    /* TRUE only in greedy case. The non-greedy case could be replaced by
    an OP_EXACT, but it is probably not worth it. (And note that OP_EXACT
    uses more memory, which we cannot get at this stage.) */

    return base_list[1] != 0;

    case OP_KET:
    /* If the bracket is capturing, and referenced by an OP_RECURSE, or
    it is an atomic sub-pattern (assert, once, etc.) the non-greedy case
    cannot be converted to a possessive form. */

    if (base_list[1] == 0) return FALSE;

    switch(*(code - GET(code, 1)))
      {
      case OP_ASSERT:
      case OP_ASSERT_NOT:
      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      case OP_ONCE:
      case OP_ONCE_NC:
      /* Atomic sub-patterns and assertions can always auto-possessify their
      last iterator. However, if the group was entered as a result of checking
      a previous iterator, this is not possible. */

      return !entered_a_group;
      }

    code += PRIV(OP_lengths)[c];
    continue;

    case OP_ONCE:
    case OP_ONCE_NC:
    case OP_BRA:
    case OP_CBRA:
    next_code = code + GET(code, 1);
    code += PRIV(OP_lengths)[c];

    while (*next_code == OP_ALT)
      {
      if (!compare_opcodes(code, utf, cb, base_list, base_end, rec_limit))
        return FALSE;
      code = next_code + 1 + LINK_SIZE;
      next_code += GET(next_code, 1);
      }

    entered_a_group = TRUE;
    continue;

    case OP_BRAZERO:
    case OP_BRAMINZERO:

    next_code = code + 1;
    if (*next_code != OP_BRA && *next_code != OP_CBRA
        && *next_code != OP_ONCE && *next_code != OP_ONCE_NC) return FALSE;

    do next_code += GET(next_code, 1); while (*next_code == OP_ALT);

    /* The bracket content will be checked by the OP_BRA/OP_CBRA case above. */

    next_code += 1 + LINK_SIZE;
    if (!compare_opcodes(next_code, utf, cb, base_list, base_end, rec_limit))
      return FALSE;

    code += PRIV(OP_lengths)[c];
    continue;

    default:
    break;
    }

  /* Check for a supported opcode, and load its properties. */

  code = get_chr_property_list(code, utf, cb->fcc, list);
  if (code == NULL) return FALSE;    /* Unsupported */

  /* If either opcode is a small character list, set pointers for comparing
  characters from that list with another list, or with a property. */

  if (base_list[0] == OP_CHAR)
    {
    chr_ptr = base_list + 2;
    list_ptr = list;
    }
  else if (list[0] == OP_CHAR)
    {
    chr_ptr = list + 2;
    list_ptr = base_list;
    }

  /* Character bitsets can also be compared to certain opcodes. */

  else if (base_list[0] == OP_CLASS || list[0] == OP_CLASS
#if PCRE2_CODE_UNIT_WIDTH == 8
      /* In 8 bit, non-UTF mode, OP_CLASS and OP_NCLASS are the same. */
      || (!utf && (base_list[0] == OP_NCLASS || list[0] == OP_NCLASS))
#endif
      )
    {
#if PCRE2_CODE_UNIT_WIDTH == 8
    if (base_list[0] == OP_CLASS || (!utf && base_list[0] == OP_NCLASS))
#else
    if (base_list[0] == OP_CLASS)
#endif
      {
      set1 = (uint8_t *)(base_end - base_list[2]);
      list_ptr = list;
      }
    else
      {
      set1 = (uint8_t *)(code - list[2]);
      list_ptr = base_list;
      }

    invert_bits = FALSE;
    switch(list_ptr[0])
      {
      case OP_CLASS:
      case OP_NCLASS:
      set2 = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      xclass_flags = (list_ptr == list ? code : base_end) - list_ptr[2] + LINK_SIZE;
      if ((*xclass_flags & XCL_HASPROP) != 0) return FALSE;
      if ((*xclass_flags & XCL_MAP) == 0)
        {
        /* No bits are set for characters < 256. */
        if (list[1] == 0) return TRUE;
        /* Might be an empty repeat. */
        continue;
        }
      set2 = (uint8_t *)(xclass_flags + 1);
      break;
#endif

      case OP_NOT_DIGIT:
      invert_bits = TRUE;
      /* Fall through */
      case OP_DIGIT:
      set2 = (uint8_t *)(cb->cbits + cbit_digit);
      break;

      case OP_NOT_WHITESPACE:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WHITESPACE:
      set2 = (uint8_t *)(cb->cbits + cbit_space);
      break;

      case OP_NOT_WORDCHAR:
      invert_bits = TRUE;
      /* Fall through */
      case OP_WORDCHAR:
      set2 = (uint8_t *)(cb->cbits + cbit_word);
      break;

      default:
      return FALSE;
      }

    /* Because the bit sets are unaligned bytes, we need to perform byte
    comparison here. */

    set_end = set1 + 32;
    if (invert_bits)
      {
      do
        {
        if ((*set1++ & ~(*set2++)) != 0) return FALSE;
        }
      while (set1 < set_end);
      }
    else
      {
      do
        {
        if ((*set1++ & *set2++) != 0) return FALSE;
        }
      while (set1 < set_end);
      }

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Some property combinations also acceptable. Unicode property opcodes are
  processed specially; the rest can be handled with a lookup table. */

  else
    {
    uint32_t leftop, rightop;

    leftop = base_list[0];
    rightop = list[0];

#ifdef SUPPORT_UNICODE
    accepted = FALSE; /* Always set in non-unicode case. */
    if (leftop == OP_PROP || leftop == OP_NOTPROP)
      {
      if (rightop == OP_EOD)
        accepted = TRUE;
      else if (rightop == OP_PROP || rightop == OP_NOTPROP)
        {
        int n;
        const uint8_t *p;
        BOOL same = leftop == rightop;
        BOOL lisprop = leftop == OP_PROP;
        BOOL risprop = rightop == OP_PROP;
        BOOL bothprop = lisprop && risprop;

        /* There's a table that specifies how each combination is to be
        processed:
          0   Always return FALSE (never auto-possessify)
          1   Character groups are distinct (possessify if both are OP_PROP)
          2   Check character categories in the same group (general or particular)
          3   Return TRUE if the two opcodes are not the same
          ... see comments below
        */

        n = propposstab[base_list[2]][list[2]];
        switch(n)
          {
          case 0: break;
          case 1: accepted = bothprop; break;
          case 2: accepted = (base_list[3] == list[3]) != same; break;
          case 3: accepted = !same; break;

          case 4:  /* Left general category, right particular category */
          accepted = risprop && catposstab[base_list[3]][list[3]] == same;
          break;

          case 5:  /* Right general category, left particular category */
          accepted = lisprop && catposstab[list[3]][base_list[3]] == same;
          break;

          /* This code is logically tricky. Think hard before fiddling with it.
          The posspropstab table has four entries per row. Each row relates to
          one of PCRE's special properties such as ALNUM or SPACE or WORD.
          Only WORD actually needs all four entries, but using repeats for the
          others means they can all use the same code below.

          The first two entries in each row are Unicode general categories, and
          apply always, because all the characters they include are part of the
          PCRE character set. The third and fourth entries are a general and a
          particular category, respectively, that include one or more relevant
          characters. One or the other is used, depending on whether the check
          is for a general or a particular category. However, in both cases the
          category contains more characters than the specials that are defined
          for the property being tested against. Therefore, it cannot be used
          in a NOTPROP case.

          Example: the row for WORD contains ucp_L, ucp_N, ucp_P, ucp_Po.
          Underscore is covered by ucp_P or ucp_Po. */

          case 6:  /* Left alphanum vs right general category */
          case 7:  /* Left space vs right general category */
          case 8:  /* Left word vs right general category */
          p = posspropstab[n-6];
          accepted = risprop && lisprop ==
            (list[3] != p[0] &&
             list[3] != p[1] &&
            (list[3] != p[2] || !lisprop));
          break;

          case 9:   /* Right alphanum vs left general category */
          case 10:  /* Right space vs left general category */
          case 11:  /* Right word vs left general category */
          p = posspropstab[n-9];
          accepted = lisprop && risprop ==
            (base_list[3] != p[0] &&
             base_list[3] != p[1] &&
            (base_list[3] != p[2] || !risprop));
          break;

          case 12:  /* Left alphanum vs right particular category */
          case 13:  /* Left space vs right particular category */
          case 14:  /* Left word vs right particular category */
          p = posspropstab[n-12];
          accepted = risprop && lisprop ==
            (catposstab[p[0]][list[3]] &&
             catposstab[p[1]][list[3]] &&
            (list[3] != p[3] || !lisprop));
          break;

          case 15:  /* Right alphanum vs left particular category */
          case 16:  /* Right space vs left particular category */
          case 17:  /* Right word vs left particular category */
          p = posspropstab[n-15];
          accepted = lisprop && risprop ==
            (catposstab[p[0]][base_list[3]] &&
             catposstab[p[1]][base_list[3]] &&
            (base_list[3] != p[3] || !risprop));
          break;
          }
        }
      }

    else
#endif  /* SUPPORT_UNICODE */

    accepted = leftop >= FIRST_AUTOTAB_OP && leftop <= LAST_AUTOTAB_LEFT_OP &&
           rightop >= FIRST_AUTOTAB_OP && rightop <= LAST_AUTOTAB_RIGHT_OP &&
           autoposstab[leftop - FIRST_AUTOTAB_OP][rightop - FIRST_AUTOTAB_OP];

    if (!accepted) return FALSE;

    if (list[1] == 0) return TRUE;
    /* Might be an empty repeat. */
    continue;
    }

  /* Control reaches here only if one of the items is a small character list.
  All characters are checked against the other side. */

  do
    {
    chr = *chr_ptr;

    switch(list_ptr[0])
      {
      case OP_CHAR:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr) return FALSE;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      break;

      case OP_NOT:
      ochr_ptr = list_ptr + 2;
      do
        {
        if (chr == *ochr_ptr)
          break;
        ochr_ptr++;
        }
      while(*ochr_ptr != NOTACHAR);
      if (*ochr_ptr == NOTACHAR) return FALSE;   /* Not found */
      break;

      /* Note that OP_DIGIT etc. are generated only when PCRE2_UCP is *not*
      set. When it is set, \d etc. are converted into OP_(NOT_)PROP codes. */

      case OP_DIGIT:
      if (chr < 256 && (cb->ctypes[chr] & ctype_digit) != 0) return FALSE;
      break;

      case OP_NOT_DIGIT:
      if (chr > 255 || (cb->ctypes[chr] & ctype_digit) == 0) return FALSE;
      break;

      case OP_WHITESPACE:
      if (chr < 256 && (cb->ctypes[chr] & ctype_space) != 0) return FALSE;
      break;

      case OP_NOT_WHITESPACE:
      if (chr > 255 || (cb->ctypes[chr] & ctype_space) == 0) return FALSE;
      break;

      case OP_WORDCHAR:
      if (chr < 255 && (cb->ctypes[chr] & ctype_word) != 0) return FALSE;
      break;

      case OP_NOT_WORDCHAR:
      if (chr > 255 || (cb->ctypes[chr] & ctype_word) == 0) return FALSE;
      break;

      case OP_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_HSPACE:
      switch(chr)
        {
        HSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: return FALSE;
        default: break;
        }
      break;

      case OP_NOT_VSPACE:
      switch(chr)
        {
        VSPACE_CASES: break;
        default: return FALSE;
        }
      break;

      case OP_DOLL:
      case OP_EODN:
      switch (chr)
        {
        case CHAR_CR:
        case CHAR_LF:
        case CHAR_VT:
        case CHAR_FF:
        case CHAR_NEL:
#ifndef EBCDIC
        case 0x2028:
        case 0x2029:
#endif  /* Not EBCDIC */
        return FALSE;
        }
      break;

      case OP_EOD:    /* Can always possessify before \z */
      break;

#ifdef SUPPORT_UNICODE
      case OP_PROP:
      case OP_NOTPROP:
      if (!check_char_prop(chr, list_ptr[2], list_ptr[3],
            list_ptr[0] == OP_NOTPROP))
        return FALSE;
      break;
#endif

      case OP_NCLASS:
      if (chr > 255) return FALSE;
      /* Fall through */

      case OP_CLASS:
      if (chr > 255) break;
      class_bitset = (uint8_t *)
        ((list_ptr == list ? code : base_end) - list_ptr[2]);
      if ((class_bitset[chr >> 3] & (1 << (chr & 7))) != 0) return FALSE;
      break;

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if (PRIV(xclass)(chr, (list_ptr == list ? code : base_end) -
          list_ptr[2] + LINK_SIZE, utf)) return FALSE;
      break;
#endif

      default:
      return FALSE;
      }

    chr_ptr++;
    }
  while(*chr_ptr != NOTACHAR);

  /* At least one character must be matched from this opcode. */

  if (list[1] == 0) return TRUE;
  }

/* Control never reaches here. There used to be a fail-save return FALSE; here,
but some compilers complain about an unreachable statement. */
}